

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int gm_mt_worker_hook(void *arg1,void *unused)

{
  AV1_COMP *cpi_00;
  int iVar1;
  MotionModel *motion_models;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int ref_buf_idx;
  _Bool gm_mt_exit;
  int cur_dir;
  aom_internal_error_info *error_info;
  MACROBLOCKD *xd;
  pthread_mutex_t *gm_mt_mutex_;
  GlobalMotionData *gm_thread_data;
  int thread_id;
  GlobalMotionJobInfo *job_info;
  AV1GlobalMotionSync *gm_sync;
  GlobalMotionInfo *gm_info;
  AV1_COMP *cpi;
  EncWorkerData *thread_data;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_74;
  byte local_6d;
  int local_6c;
  undefined8 *local_68;
  long local_60;
  pthread_mutex_t *__mutex;
  int frame;
  AV1GlobalMotionSync *ref_buf;
  aom_internal_error_info *error_info_00;
  AV1_COMP *cpi_01;
  int local_4;
  
  cpi_00 = (AV1_COMP *)*in_RDI;
  cpi_01 = (AV1_COMP *)&cpi_00->gm_info;
  ref_buf = &(cpi_00->mt_info).gm_sync;
  frame = *(int *)((long)in_RDI + 0x1cc);
  motion_models = (MotionModel *)(in_RDI[1] + 0x26df8);
  __mutex = (cpi_00->mt_info).gm_sync.mutex_;
  local_60 = in_RDI[1] + 0x1a0;
  local_68 = in_RDI + 3;
  *(undefined8 **)(in_RDI[1] + 0x2b90) = local_68;
  error_info_00 = (aom_internal_error_info *)ref_buf;
  iVar1 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x1e));
  if (iVar1 == 0) {
    *(undefined4 *)(local_68 + 0x1a) = 1;
    local_6c = (int)(ref_buf->job_info).thread_id_to_dir[frame];
    local_6d = 0;
    while( true ) {
      local_74 = -1;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      local_6d = error_info_00->detail[0x48] & 1;
      if (local_6d == 0) {
        iVar1 = get_next_gm_job(cpi_00,&local_74,local_6c);
        if (iVar1 == 0) {
          switch_direction((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                           ,(int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (int *)0x255f77);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (((local_6d & 1) != 0) || (local_74 == -1)) break;
      in_stack_ffffffffffffff78 =
           *(undefined4 *)(cpi_01->enc_quant_dequant_params).quants.y_quant[0xb];
      in_stack_ffffffffffffff80 =
           *(undefined4 *)((cpi_01->enc_quant_dequant_params).quants.y_quant[0xb] + 2);
      av1_compute_gm_for_valid_ref_frames
                (cpi_01,error_info_00,(YV12_BUFFER_CONFIG **)ref_buf,frame,motion_models,
                 (uint8_t *)__mutex->__size,(int)in_RDI,(int)in_RSI);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (((cpi_00->sf).gm_sf.prune_ref_frame_for_gm_search != 0) &&
         ((cpi_00->common).global_motion[local_74].wmtype < 2)) {
        (ref_buf->job_info).early_exit[local_6c] = '\x01';
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    *(undefined4 *)(local_68 + 0x1a) = 0;
    local_4 = 1;
  }
  else {
    *(undefined4 *)(local_68 + 0x1a) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    error_info_00->detail[0x48] = '\x01';
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int gm_mt_worker_hook(void *arg1, void *unused) {
  (void)unused;

  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1_COMP *cpi = thread_data->cpi;
  GlobalMotionInfo *gm_info = &cpi->gm_info;
  AV1GlobalMotionSync *gm_sync = &cpi->mt_info.gm_sync;
  GlobalMotionJobInfo *job_info = &gm_sync->job_info;
  int thread_id = thread_data->thread_id;
  GlobalMotionData *gm_thread_data = &thread_data->td->gm_data;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *gm_mt_mutex_ = gm_sync->mutex_;
#endif

  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(gm_mt_mutex_);
    gm_sync->gm_mt_exit = true;
    pthread_mutex_unlock(gm_mt_mutex_);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  int cur_dir = job_info->thread_id_to_dir[thread_id];
  bool gm_mt_exit = false;
  while (1) {
    int ref_buf_idx = -1;

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(gm_mt_mutex_);
#endif

    gm_mt_exit = gm_sync->gm_mt_exit;
    // Populates ref_buf_idx(the reference frame type) for which global motion
    // estimation will be done.
    if (!gm_mt_exit && !get_next_gm_job(cpi, &ref_buf_idx, cur_dir)) {
      // No jobs are available for the current direction. Switch
      // to other direction and get the next job, if available.
      switch_direction(cpi, &ref_buf_idx, &cur_dir);
    }

#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(gm_mt_mutex_);
#endif

    // When gm_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (gm_mt_exit || ref_buf_idx == -1) break;

    // Compute global motion for the given ref_buf_idx.
    av1_compute_gm_for_valid_ref_frames(
        cpi, error_info, gm_info->ref_buf, ref_buf_idx,
        gm_thread_data->motion_models, gm_thread_data->segment_map,
        gm_info->segment_map_w, gm_info->segment_map_h);

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(gm_mt_mutex_);
#endif
    // If global motion w.r.t. current ref frame is
    // INVALID/TRANSLATION/IDENTITY, skip the evaluation of global motion w.r.t
    // the remaining ref frames in that direction.
    if (cpi->sf.gm_sf.prune_ref_frame_for_gm_search &&
        cpi->common.global_motion[ref_buf_idx].wmtype <= TRANSLATION)
      job_info->early_exit[cur_dir] = 1;

#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(gm_mt_mutex_);
#endif
  }
  error_info->setjmp = 0;
  return 1;
}